

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * QByteArray::trimmed_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  QStringAlgorithms<const_QByteArray>::trimmed_helper(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::trimmed_helper(const QByteArray &a)
{
    return QStringAlgorithms<const QByteArray>::trimmed_helper(a);
}